

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O2

double average_time<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                 (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
                 size_t trials,size_t times)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  timer elapsed;
  timer local_30;
  
  dVar6 = 0.0;
  sVar2 = trials;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    timer::timer(&local_30);
    single_run<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
              (generator,times);
    dVar4 = timer::elapsed(&local_30);
    dVar6 = dVar6 + dVar4;
  }
  lVar1 = times * trials;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  return (((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 1e-06) / dVar6;
}

Assistant:

double average_time(G& generator, size_t trials, size_t times ) {
    double average_time = 0.0;

    for ( size_t i = 0; i < trials; ++i ) {
        timer elapsed;
        single_run( generator, times );
        average_time += elapsed.elapsed();
    }

    return trials * times / average_time / 1000000.0;
}